

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableStringFieldGenerator::GenerateSerializedSizeCode
          (RepeatedImmutableStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"{\n  int dataSize = 0;\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,
                     "for (int i = 0; i < $name$_.size(); i++) {\n  dataSize += computeStringSizeNoTag($name$_.getRaw(i));\n}\n"
                    );
  io::Printer::Print<>(printer,"size += dataSize;\n");
  io::Printer::Print(printer,variables,"size += $tag_size$ * get$capitalized_name$List().size();\n")
  ;
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void RepeatedImmutableStringFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "{\n"
                 "  int dataSize = 0;\n");
  printer->Indent();

  printer->Print(variables_,
                 "for (int i = 0; i < $name$_.size(); i++) {\n"
                 "  dataSize += computeStringSizeNoTag($name$_.getRaw(i));\n"
                 "}\n");

  printer->Print("size += dataSize;\n");

  printer->Print(variables_,
                 "size += $tag_size$ * get$capitalized_name$List().size();\n");

  printer->Outdent();
  printer->Print("}\n");
}